

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O1

bool __thiscall CaptureSummary::Merge(CaptureSummary *this,size_t nb_files,char **file_name)

{
  bool bVar1;
  CaptureSummary **cs;
  long *plVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  CaptureSummary *this_00;
  CaptureSummary *pCVar6;
  bool bVar7;
  
  uVar5 = nb_files + 1;
  cs = (CaptureSummary **)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
  plVar2 = (long *)operator_new__(-(ulong)(uVar5 >> 0x3b != 0) | uVar5 * 0x20 | 8);
  pCVar6 = (CaptureSummary *)(plVar2 + 1);
  *plVar2 = nb_files + 1;
  if (nb_files + 1 != 0) {
    lVar4 = 0;
    this_00 = pCVar6;
    do {
      CaptureSummary(this_00);
      lVar4 = lVar4 + -0x20;
      this_00 = this_00 + 1;
    } while (~nb_files * 0x20 != lVar4);
  }
  if (nb_files == 0) {
    bVar1 = true;
  }
  else {
    sVar3 = 0;
    do {
      cs[sVar3] = pCVar6;
      sVar3 = sVar3 + 1;
      pCVar6 = pCVar6 + 1;
    } while (nb_files != sVar3);
    uVar5 = 1;
    do {
      bVar1 = Load(cs[uVar5 - 1],file_name[uVar5 - 1]);
      if (!bVar1) break;
      bVar7 = uVar5 < nb_files;
      uVar5 = uVar5 + 1;
    } while (bVar7);
  }
  if (bVar1 != false) {
    bVar1 = Merge(this,nb_files,cs);
  }
  if (*plVar2 != 0) {
    lVar4 = *plVar2 << 5;
    do {
      ~CaptureSummary((CaptureSummary *)((long)plVar2 + lVar4 + -0x18));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != 0);
  }
  operator_delete__(plVar2);
  operator_delete__(cs);
  return bVar1;
}

Assistant:

bool CaptureSummary::Merge(size_t nb_files, char const ** file_name)
{
    CaptureSummary ** list = new  CaptureSummary*[nb_files + 1];
    CaptureSummary * baselist = new  CaptureSummary[nb_files + 1];

    bool ret = list != NULL && baselist != NULL;

    if (ret)
    {
        for (size_t i = 0; ret && i < nb_files; i++)
        {
            list[i] = &baselist[i];
        }
    }

    for (size_t i=0; ret && i < nb_files; i++)
    {
        ret = list[i]->Load(file_name[i]);
    }

    if (ret)
    {
        ret = Merge(nb_files, list);
    }

    if (baselist != NULL)
    {
        delete[] baselist;
    }

    if (list != NULL)
    {
        delete[] list;
    }

    return ret;
}